

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,char Separator,int MaxSplit,
          bool KeepEmpty)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  undefined3 in_register_00000081;
  ulong uVar5;
  int iVar6;
  StringRef local_68;
  undefined4 local_4c;
  SmallVectorImpl<llvm::StringRef> *local_48;
  StringRef local_40;
  
  local_4c = CONCAT31(in_register_00000081,KeepEmpty);
  local_68.Data = this->Data;
  local_68.Length = this->Length;
  iVar6 = MaxSplit + 1;
  local_48 = A;
  do {
    sVar2 = local_68.Length;
    pcVar1 = local_68.Data;
    iVar6 = iVar6 + -1;
    if (iVar6 == 0) break;
    if (local_68.Length == 0) {
LAB_00167982:
      uVar5 = 0xffffffffffffffff;
    }
    else {
      pvVar3 = memchr(local_68.Data,(int)CONCAT71(in_register_00000011,Separator),local_68.Length);
      if (pvVar3 == (void *)0x0) goto LAB_00167982;
      uVar5 = (long)pvVar3 - (long)pcVar1;
    }
    if (uVar5 == 0xffffffffffffffff) break;
    if (uVar5 != 0 || KeepEmpty) {
      local_40.Length = uVar5;
      if (sVar2 < uVar5) {
        local_40.Length = local_68.Length;
      }
      local_40.Data = local_68.Data;
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&local_48->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_40);
    }
    uVar4 = uVar5 + 1;
    if (local_68.Length <= uVar5) {
      uVar4 = local_68.Length;
    }
    local_68.Data = local_68.Data + uVar4;
    local_68.Length = local_68.Length - uVar4;
  } while (uVar5 != 0xffffffffffffffff);
  if (((char)local_4c != '\0') || (local_68.Length != 0)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&local_48->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_68);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A, char Separator,
                      int MaxSplit, bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + 1, npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}